

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

MockSpec<char_*(unsigned_long)> * __thiscall
testing::internal::FunctionMocker<char_*(unsigned_long)>::With
          (FunctionMocker<char_*(unsigned_long)> *this,Matcher<unsigned_long> *m1)

{
  linked_ptr_internal lVar1;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_> local_28;
  
  local_28.value_ = (m1->super_MatcherBase<unsigned_long>).impl_.value_;
  lVar1.next_ = &local_28.link_;
  if (local_28.value_ != (MatcherInterface<unsigned_long> *)0x0) {
    linked_ptr_internal::join(&local_28.link_,&(m1->super_MatcherBase<unsigned_long>).impl_.link_);
    lVar1.next_ = local_28.link_.next_;
  }
  local_28.link_.next_ = lVar1.next_;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::operator=
            (&(this->super_FunctionMockerBase<char_*(unsigned_long)>).current_spec_.matchers_.f0_.
              super_MatcherBase<unsigned_long>.impl_,&local_28);
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr(&local_28);
  return &(this->super_FunctionMockerBase<char_*(unsigned_long)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }